

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGImpactCollisionAlgorithm.cpp
# Opt level: O3

void __thiscall
btGImpactCollisionAlgorithm::gimpact_vs_compoundshape
          (btGImpactCollisionAlgorithm *this,btCollisionObjectWrapper *body0Wrap,
          btCollisionObjectWrapper *body1Wrap,btGImpactShapeInterface *shape0,
          btCompoundShape *shape1,bool swapped)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  btTransform *pbVar6;
  btCompoundShapeChild *pbVar7;
  btManifoldResult *pbVar8;
  btCollisionObjectWrapper **ppbVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  btCollisionObjectWrapper *pbVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  btCollisionObjectWrapper ob1;
  btCollisionObjectWrapper local_200;
  btTransform local_1d8;
  undefined8 local_198;
  undefined8 uStack_190;
  float local_188;
  float fStack_184;
  undefined8 uStack_180;
  float local_178;
  float fStack_174;
  undefined8 uStack_170;
  float local_168;
  float fStack_164;
  undefined8 uStack_160;
  float local_158;
  float fStack_154;
  btScalar bStack_150;
  btScalar bStack_14c;
  undefined1 local_148 [16];
  float local_138;
  float fStack_134;
  btScalar bStack_130;
  btScalar bStack_12c;
  float local_128;
  float fStack_124;
  btScalar bStack_120;
  btScalar bStack_11c;
  float local_118;
  float fStack_114;
  btScalar bStack_110;
  btScalar bStack_10c;
  float local_108;
  float fStack_104;
  btScalar bStack_100;
  btScalar bStack_fc;
  float local_f8;
  float fStack_f4;
  btScalar bStack_f0;
  btScalar bStack_ec;
  float local_e8;
  float fStack_e4;
  btScalar bStack_e0;
  btScalar bStack_dc;
  float local_d8;
  float fStack_d4;
  btScalar bStack_d0;
  btScalar bStack_cc;
  float local_c8;
  float fStack_c4;
  btScalar bStack_c0;
  btScalar bStack_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  iVar10 = (shape1->m_children).m_size;
  lVar12 = (long)iVar10;
  if (lVar12 != 0) {
    pbVar6 = body1Wrap->m_worldTransform;
    local_d8 = (pbVar6->m_basis).m_el[0].m_floats[0];
    local_e8 = (pbVar6->m_basis).m_el[0].m_floats[1];
    local_c8 = (pbVar6->m_basis).m_el[0].m_floats[2];
    local_108 = (pbVar6->m_basis).m_el[1].m_floats[0];
    local_118 = (pbVar6->m_basis).m_el[1].m_floats[1];
    local_f8 = (pbVar6->m_basis).m_el[1].m_floats[2];
    local_138 = (pbVar6->m_basis).m_el[2].m_floats[0];
    local_128 = (pbVar6->m_basis).m_el[2].m_floats[2];
    pbVar8 = this->m_resultOut;
    local_b8 = ZEXT416((uint)local_128);
    local_a8 = ZEXT416((uint)local_138);
    local_158 = (pbVar6->m_basis).m_el[2].m_floats[1];
    local_148 = ZEXT416((uint)local_158);
    local_68 = ZEXT416((uint)local_c8);
    local_98 = ZEXT416((uint)local_f8);
    uStack_160 = 0;
    local_48 = ZEXT416((uint)local_d8);
    local_78 = ZEXT416((uint)local_108);
    uStack_170 = 0;
    local_58 = ZEXT416((uint)local_e8);
    local_88 = ZEXT416((uint)local_118);
    uStack_180 = 0;
    lVar11 = lVar12 * 0x58 + -0x18;
    local_198 = *(undefined8 *)(pbVar6->m_origin).m_floats;
    uStack_190 = 0;
    fVar1 = (pbVar6->m_origin).m_floats[2];
    fStack_154 = local_158;
    bStack_150 = local_158;
    bStack_14c = local_158;
    fStack_134 = local_138;
    bStack_130 = local_138;
    bStack_12c = local_138;
    fStack_124 = local_128;
    bStack_120 = local_128;
    bStack_11c = local_128;
    fStack_114 = local_118;
    bStack_110 = local_118;
    bStack_10c = local_118;
    fStack_104 = local_108;
    bStack_100 = local_108;
    bStack_fc = local_108;
    fStack_f4 = local_f8;
    bStack_f0 = local_f8;
    bStack_ec = local_f8;
    fStack_e4 = local_e8;
    bStack_e0 = local_e8;
    bStack_dc = local_e8;
    fStack_d4 = local_d8;
    bStack_d0 = local_d8;
    bStack_cc = local_d8;
    fStack_c4 = local_c8;
    bStack_c0 = local_c8;
    bStack_bc = local_c8;
    local_188 = local_e8;
    fStack_184 = local_118;
    local_178 = local_d8;
    fStack_174 = local_108;
    local_168 = local_c8;
    fStack_164 = local_f8;
    do {
      iVar10 = iVar10 + -1;
      pbVar7 = (shape1->m_children).m_data;
      fVar2 = *(float *)((long)(pbVar7->m_transform).m_basis.m_el[0].m_floats + lVar11 + -0x38);
      fVar3 = *(float *)((long)(pbVar7->m_transform).m_basis.m_el[0].m_floats + lVar11 + -0x28);
      fVar4 = *(float *)((long)(pbVar7->m_transform).m_basis.m_el[0].m_floats + lVar11 + -0x18);
      local_1d8.m_basis.m_el[0].m_floats[2] =
           fVar4 * (float)local_68._0_4_ +
           fVar2 * (float)local_48._0_4_ + (float)local_58._0_4_ * fVar3;
      local_1d8.m_basis.m_el[1].m_floats[2] =
           fVar4 * (float)local_98._0_4_ +
           fVar2 * (float)local_78._0_4_ + (float)local_88._0_4_ * fVar3;
      local_1d8.m_basis.m_el[2].m_floats[2] =
           fVar4 * (float)local_b8._0_4_ +
           fVar2 * (float)local_a8._0_4_ + fVar3 * (float)local_148._0_4_;
      fVar2 = *(float *)((long)((pbVar7->m_transform).m_basis.m_el + -1) + lVar11);
      fVar3 = *(float *)((long)(pbVar7->m_transform).m_basis.m_el[0].m_floats + lVar11 + -0xc);
      fVar4 = *(float *)((long)(pbVar7->m_transform).m_basis.m_el[0].m_floats + lVar11 + -8);
      uVar5 = *(undefined8 *)((long)(&pbVar7->m_transform + -1) + lVar11);
      fVar14 = (float)uVar5;
      fVar15 = (float)((ulong)uVar5 >> 0x20);
      uVar5 = *(undefined8 *)((long)(&(pbVar7->m_transform).m_basis + -1) + lVar11);
      fVar16 = (float)uVar5;
      fVar17 = (float)((ulong)uVar5 >> 0x20);
      uVar5 = *(undefined8 *)((long)((pbVar7->m_transform).m_basis.m_el + -2) + lVar11);
      fVar18 = (float)uVar5;
      fVar19 = (float)((ulong)uVar5 >> 0x20);
      local_200.m_shape =
           *(btCollisionShape **)((long)(pbVar7->m_transform).m_basis.m_el[0].m_floats + lVar11);
      local_1d8.m_basis.m_el[0].m_floats[1] =
           fVar19 * fStack_c4 + fVar15 * fStack_d4 + fStack_e4 * fVar17;
      local_1d8.m_basis.m_el[0].m_floats[0] =
           fVar18 * local_c8 + fVar14 * local_d8 + local_e8 * fVar16;
      local_1d8.m_basis.m_el[0].m_floats[3] = 0.0;
      local_1d8.m_basis.m_el[1].m_floats[1] =
           fVar19 * fStack_f4 + fVar15 * fStack_104 + fStack_114 * fVar17;
      local_1d8.m_basis.m_el[1].m_floats[0] =
           fVar18 * local_f8 + fVar14 * local_108 + local_118 * fVar16;
      local_1d8.m_basis.m_el[1].m_floats[3] = 0.0;
      local_1d8.m_basis.m_el[2].m_floats[1] =
           fVar19 * fStack_124 + fVar15 * fStack_134 + fVar17 * fStack_154;
      local_1d8.m_basis.m_el[2].m_floats[0] =
           fVar18 * local_128 + fVar14 * local_138 + fVar16 * local_158;
      local_1d8.m_basis.m_el[2].m_floats[3] = 0.0;
      local_1d8.m_origin.m_floats[1] =
           fVar4 * fStack_164 + fVar2 * fStack_174 + fVar3 * fStack_184 + local_198._4_4_;
      local_1d8.m_origin.m_floats[0] =
           fVar4 * local_168 + fVar2 * local_178 + fVar3 * local_188 + (float)local_198;
      local_1d8.m_origin.m_floats[2] =
           fVar4 * (float)local_b8._0_4_ +
           fVar2 * (float)local_a8._0_4_ + (float)local_148._0_4_ * fVar3 + fVar1;
      local_1d8.m_origin.m_floats[3] = 0.0;
      local_200.m_collisionObject = body1Wrap->m_collisionObject;
      local_200.m_worldTransform = &local_1d8;
      local_200.m_partId = -1;
      pbVar13 = pbVar8->m_body0Wrap;
      if (pbVar13->m_collisionObject == local_200.m_collisionObject) {
        ppbVar9 = &pbVar8->m_body0Wrap;
      }
      else {
        pbVar13 = pbVar8->m_body1Wrap;
        ppbVar9 = &pbVar8->m_body1Wrap;
      }
      lVar12 = lVar12 + -1;
      *ppbVar9 = &local_200;
      local_200.m_parent = body1Wrap;
      local_200.m_index = iVar10;
      gimpact_vs_shape(this,body0Wrap,&local_200,shape0,local_200.m_shape,swapped);
      pbVar8 = this->m_resultOut;
      (&pbVar8->m_body0Wrap)[pbVar8->m_body0Wrap->m_collisionObject != local_200.m_collisionObject]
           = pbVar13;
      lVar11 = lVar11 + -0x58;
    } while (lVar12 != 0);
  }
  return;
}

Assistant:

void btGImpactCollisionAlgorithm::gimpact_vs_compoundshape(const btCollisionObjectWrapper* body0Wrap,
				  const btCollisionObjectWrapper* body1Wrap,
				  const btGImpactShapeInterface * shape0,
				  const btCompoundShape * shape1,bool swapped)
{
	btTransform orgtrans1 = body1Wrap->getWorldTransform();

	int i = shape1->getNumChildShapes();
	while(i--)
	{

		const btCollisionShape * colshape1 = shape1->getChildShape(i);
		btTransform childtrans1 = orgtrans1*shape1->getChildTransform(i);

		btCollisionObjectWrapper ob1(body1Wrap,colshape1,body1Wrap->getCollisionObject(),childtrans1,-1,i);
		
		const btCollisionObjectWrapper* tmp = 0;
		if (m_resultOut->getBody0Wrap()->getCollisionObject()==ob1.getCollisionObject())
		{
			tmp = m_resultOut->getBody0Wrap();
			m_resultOut->setBody0Wrap(&ob1);
		} else
		{
			tmp = m_resultOut->getBody1Wrap();
			m_resultOut->setBody1Wrap(&ob1);
		}
		//collide child shape
		gimpact_vs_shape(body0Wrap, &ob1,
					  shape0,colshape1,swapped);

		if (m_resultOut->getBody0Wrap()->getCollisionObject()==ob1.getCollisionObject())
		{
			m_resultOut->setBody0Wrap(tmp);
		} else
		{
			m_resultOut->setBody1Wrap(tmp);
		}
	}
}